

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  undefined1 *puVar1;
  uint count;
  uint64_t uVar2;
  byte bVar3;
  undefined4 extraout_EAX;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  secp256k1_scratch_space *scratch;
  long lVar7;
  code *pcVar8;
  byte bVar9;
  secp256k1_scalar *psVar10;
  secp256k1_ge *psVar11;
  long extraout_RDX;
  secp256k1_ge *scratch_00;
  size_t sVar12;
  secp256k1_gej *r;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  secp256k1_strauss_point_state *psVar17;
  uchar *out32;
  secp256k1_sha256 *psVar18;
  secp256k1_gej *psVar19;
  secp256k1_ge *b;
  secp256k1_scalar *b_00;
  secp256k1_gej *psVar20;
  secp256k1_gej *psVar21;
  code *cb;
  secp256k1_ge *cbdata;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  uint uVar22;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *a;
  ulong uVar23;
  secp256k1_sha256 *psVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  ulong uStack_23e0;
  secp256k1_strauss_state sStack_23d8;
  secp256k1_strauss_point_state sStack_23c0;
  secp256k1_fe asStack_1fb0 [8];
  secp256k1_ge asStack_1e30 [8];
  secp256k1_gej *psStack_1ae8;
  secp256k1_callback *psStack_1ae0;
  secp256k1_ge *psStack_1ad0;
  secp256k1_strauss_point_state *psStack_1ac8;
  secp256k1_scalar *psStack_1ac0;
  undefined1 auStack_1aa8 [8];
  undefined1 auStack_1aa0 [176];
  secp256k1_gej sStack_19f0;
  secp256k1_gej sStack_1958;
  secp256k1_gej sStack_18c0;
  secp256k1_gej sStack_1828;
  secp256k1_gej sStack_1790;
  secp256k1_gej asStack_16f8 [2];
  secp256k1_gej asStack_1578 [5];
  secp256k1_strauss_point_state sStack_1238;
  secp256k1_scratch_space *psStack_e20;
  secp256k1_sha256 *psStack_e18;
  undefined1 *puStack_e10;
  secp256k1_gej *psStack_e08;
  secp256k1_gej *psStack_e00;
  code *pcStack_df8;
  undefined4 uStack_de6;
  undefined2 uStack_de2;
  secp256k1_gej *psStack_de0;
  long lStack_dd8;
  undefined1 auStack_dd0 [40];
  undefined8 uStack_da8;
  uint64_t uStack_da0;
  uint64_t uStack_d98;
  secp256k1_sha256 sStack_d90;
  secp256k1_sha256 sStack_d20;
  secp256k1_gej *psStack_cb8;
  secp256k1_fe *psStack_cb0;
  secp256k1_ge *psStack_ca8;
  secp256k1_ge *psStack_ca0;
  secp256k1_gej *psStack_c98;
  secp256k1_strauss_point_state *psStack_c90;
  undefined1 auStack_c88 [32];
  undefined1 auStack_c68 [40];
  secp256k1_ge *psStack_c40;
  secp256k1_strauss_point_state *psStack_c38;
  secp256k1_gej sStack_c30;
  secp256k1_gej sStack_b98;
  secp256k1_gej sStack_b00;
  secp256k1_ge sStack_a68;
  secp256k1_gej sStack_a00;
  secp256k1_fe asStack_968 [8];
  secp256k1_ge asStack_7e8 [8];
  secp256k1_strauss_point_state sStack_4a8;
  int *piStack_90;
  secp256k1_scalar *psStack_88;
  
  psVar10 = s;
  secp256k1_scalar_verify(s);
  auVar26._0_4_ = -(uint)((int)s->d[2] == 0 && (int)s->d[0] == 0);
  auVar26._4_4_ = -(uint)(*(int *)((long)s->d + 0x14) == 0 && *(int *)((long)s->d + 4) == 0);
  auVar26._8_4_ = -(uint)((int)s->d[3] == 0 && (int)s->d[1] == 0);
  auVar26._12_4_ = -(uint)(*(int *)((long)s->d + 0x1c) == 0 && *(int *)((long)s->d + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar26);
  if (iVar4 == 0xf) {
    if (-1 < (int)(0x7f / (long)w)) {
      memset(wnaf,0,(0x7f / (long)w & 0xffffffffU) * 4 + 4);
    }
    return 0;
  }
  secp256k1_scalar_verify(s);
  uVar2 = s->d[0];
  b_00 = s;
  secp256k1_scalar_verify(s);
  if (0xffffffdf < w - 0x21U) {
    uVar14 = ~(uint)uVar2 & 1;
    secp256k1_scalar_verify(s);
    bVar9 = (byte)w;
    *wnaf = ((uint)((int)s->d[w - 1U >> 6] << (-bVar9 & 0x1f)) >> (-bVar9 & 0x1f)) + uVar14;
    bVar3 = 0x7f / bVar9;
    uVar13 = (ulong)bVar3;
    uVar15 = (uint)bVar3;
    uVar22 = 0x80 - (uint)bVar3 * w;
    uVar23 = uVar13;
    do {
      uVar16 = w;
      if (uVar23 == uVar13) {
        uVar16 = uVar22;
      }
      uVar5 = secp256k1_scalar_get_bits_var(s,(uint)uVar23 * w,uVar16);
      uVar16 = (uint)uVar23;
      if (uVar5 != 0) break;
      wnaf[uVar23] = 0;
      uVar15 = uVar15 - 1;
      bVar25 = 1 < (long)uVar23;
      uVar23 = uVar23 - 1;
      uVar16 = uVar15;
    } while (bVar25);
    if ((int)uVar16 < 1) {
      return uVar14;
    }
    iVar4 = -1 << (bVar9 & 0x1f);
    uVar23 = 1;
    uVar15 = w;
    do {
      count = w;
      if (uVar13 == uVar23) {
        count = uVar22;
      }
      uVar5 = secp256k1_scalar_get_bits_var(s,uVar15,count);
      if ((uVar5 & 1) == 0) {
        wnaf[uVar23 - 1] = wnaf[uVar23 - 1] + iVar4;
        uVar5 = uVar5 | 1;
      }
      wnaf[uVar23] = uVar5;
      if (1 < uVar23) {
        if (wnaf[uVar23 - 1] == -1) {
          if (0 < wnaf[uVar23 - 2]) {
            iVar6 = wnaf[uVar23 - 2] + iVar4;
            goto LAB_0014e866;
          }
        }
        else if ((wnaf[uVar23 - 1] == 1) && (wnaf[uVar23 - 2] < 0)) {
          iVar6 = wnaf[uVar23 - 2] + (1 << (bVar9 & 0x1f));
LAB_0014e866:
          wnaf[uVar23 - 2] = iVar6;
          wnaf[uVar23 - 1] = 0;
        }
      }
      uVar23 = uVar23 + 1;
      uVar15 = uVar15 + w;
      if (uVar16 + 1 == uVar23) {
        return uVar14;
      }
    } while( true );
  }
  secp256k1_wnaf_fixed_cold_1();
  uVar23 = 0x20;
  do {
    uVar14 = (int)uVar23 - 1;
    uVar23 = (ulong)uVar14;
    if (*(int *)((long)b_00->d + uVar23 * 4) != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014e8c7;
    }
  } while (8 < uVar14);
  uVar14 = 7;
  while (*(int *)((long)b_00->d + (ulong)uVar14 * 4) ==
         *(int *)((long)psVar10->d + (ulong)uVar14 * 4)) {
    bVar25 = uVar14 == 0;
    uVar14 = uVar14 - 1;
    if (bVar25) {
      return extraout_EAX_00;
    }
  }
LAB_0014e8c7:
  test_fixed_wnaf_small_helper_cold_2();
  psVar21 = (secp256k1_gej *)auStack_c88;
  psVar17 = (secp256k1_strauss_point_state *)((ulong)psVar10 & 0xffffffff);
  a = (secp256k1_scalar *)auStack_c68;
  psStack_c90 = (secp256k1_strauss_point_state *)0x14e8ef;
  piStack_90 = wnaf;
  psStack_88 = s;
  testutil_random_scalar_order_test(a);
  psStack_c90 = (secp256k1_strauss_point_state *)0x14e900;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c88,a,b_00);
  psStack_c90 = (secp256k1_strauss_point_state *)0x14e90b;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c88,(secp256k1_scalar *)auStack_c88);
  if ((int)psVar10 == 0) {
    psStack_c90 = (secp256k1_strauss_point_state *)0x14ea04;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b00,(secp256k1_scalar *)auStack_c68);
    psStack_c90 = (secp256k1_strauss_point_state *)0x14ea1b;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b98,(secp256k1_scalar *)auStack_c88);
    psStack_c90 = (secp256k1_strauss_point_state *)0x14ea2f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_c30,b_00);
  }
  else {
    psStack_c90 = (secp256k1_strauss_point_state *)0x14e923;
    testutil_random_ge_test(&sStack_a68);
    psStack_c90 = (secp256k1_strauss_point_state *)0x14e933;
    secp256k1_gej_set_ge(&sStack_a00,&sStack_a68);
    if ((int)psVar10 == 1) {
      s = (secp256k1_scalar *)asStack_968;
      unaff_R13 = asStack_7e8;
      psVar17 = &sStack_4a8;
      a = &secp256k1_scalar_zero;
      psStack_c90 = (secp256k1_strauss_point_state *)0x14e993;
      sStack_b98.x.n[0] = (uint64_t)s;
      sStack_b98.x.n[1] = (uint64_t)unaff_R13;
      sStack_b98.x.n[2] = (uint64_t)psVar17;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_b98,&sStack_b00,1,&sStack_a00,
                 (secp256k1_scalar *)auStack_c68,&secp256k1_scalar_zero);
      psStack_c90 = (secp256k1_strauss_point_state *)0x14e9be;
      sStack_c30.x.n[0] = (uint64_t)s;
      sStack_c30.x.n[1] = (uint64_t)unaff_R13;
      sStack_c30.x.n[2] = (uint64_t)psVar17;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_c30,&sStack_b98,1,&sStack_a00,
                 (secp256k1_scalar *)auStack_c88,&secp256k1_scalar_zero);
      psStack_c90 = (secp256k1_strauss_point_state *)0x14e9e6;
      auStack_c68._32_8_ = s;
      psStack_c40 = unaff_R13;
      psStack_c38 = psVar17;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_c68 + 0x20),&sStack_c30,1,&sStack_a00,b_00,
                 &secp256k1_scalar_zero);
      psVar21 = &sStack_a00;
    }
    else {
      a = (secp256k1_scalar *)&sStack_a68;
      psStack_c90 = (secp256k1_strauss_point_state *)0x14ea4e;
      secp256k1_ecmult_const(&sStack_b00,(secp256k1_ge *)a,(secp256k1_scalar *)auStack_c68);
      psStack_c90 = (secp256k1_strauss_point_state *)0x14ea61;
      secp256k1_ecmult_const(&sStack_b98,(secp256k1_ge *)a,(secp256k1_scalar *)auStack_c88);
      psStack_c90 = (secp256k1_strauss_point_state *)0x14ea71;
      secp256k1_ecmult_const(&sStack_c30,(secp256k1_ge *)a,b_00);
      psVar21 = (secp256k1_gej *)auStack_c88;
    }
  }
  psStack_c90 = (secp256k1_strauss_point_state *)0x14ea8b;
  secp256k1_gej_add_var(&sStack_c30,&sStack_c30,&sStack_b00,(secp256k1_fe *)0x0);
  psStack_c90 = (secp256k1_strauss_point_state *)0x14eaa0;
  psVar19 = &sStack_c30;
  secp256k1_gej_add_var(&sStack_c30,&sStack_c30,&sStack_b98,(secp256k1_fe *)0x0);
  psStack_c90 = (secp256k1_strauss_point_state *)0x14eaa8;
  psVar20 = &sStack_c30;
  secp256k1_gej_verify(&sStack_c30);
  if (sStack_c30.infinity != 0) {
    return extraout_EAX_01;
  }
  psStack_c90 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar20 & 0xffffffff);
  pcStack_df8 = (code *)0x14eaf6;
  psStack_de0 = psVar19;
  lStack_dd8 = extraout_RDX;
  psStack_cb8 = &sStack_c30;
  psStack_cb0 = (secp256k1_fe *)s;
  psStack_ca8 = unaff_R13;
  psStack_ca0 = (secp256k1_ge *)a;
  psStack_c98 = psVar21;
  psStack_c90 = psVar17;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_de6 = SUB84(psVar20,0);
  psVar24 = &sStack_d20;
  sStack_d20.s[0] = 0x6a09e667;
  sStack_d20.s[1] = 0xbb67ae85;
  sStack_d20.s[2] = 0x3c6ef372;
  sStack_d20.s[3] = 0xa54ff53a;
  sStack_d20.s[4] = 0x510e527f;
  sStack_d20.s[5] = 0x9b05688c;
  sStack_d20.s[6] = 0x1f83d9ab;
  sStack_d20.s[7] = 0x5be0cd19;
  psVar19 = (secp256k1_gej *)0x0;
  sStack_d20.bytes = 0;
  psVar10 = (secp256k1_scalar *)(auStack_dd0 + 0x20);
  auStack_dd0._32_8_ = 0;
  uStack_da8._0_4_ = 0;
  uStack_da8._4_4_ = 0;
  uStack_da0 = 0;
  uStack_d98 = 0;
  pcStack_df8 = (code *)0x14eb40;
  secp256k1_scalar_verify(psVar10);
  pcStack_df8 = (code *)0x14eb4e;
  test_ecmult_accumulate(psVar24,psVar10,scratch);
  auStack_dd0._32_8_ = 1;
  uStack_da8._0_4_ = 0;
  uStack_da8._4_4_ = 0;
  uStack_da0 = 0;
  uStack_d98 = 0;
  pcStack_df8 = (code *)0x14eb6a;
  secp256k1_scalar_verify(psVar10);
  pcStack_df8 = (code *)0x14eb78;
  test_ecmult_accumulate(psVar24,psVar10,scratch);
  pcStack_df8 = (code *)0x14eb83;
  secp256k1_scalar_negate(psVar10,psVar10);
  pcStack_df8 = (code *)0x14eb94;
  test_ecmult_accumulate(psVar24,psVar10,scratch);
  psVar21 = psStack_de0;
  if (psStack_de0 != (secp256k1_gej *)0x0) {
    psVar19 = (secp256k1_gej *)0x0;
    psVar24 = &sStack_d90;
    out32 = auStack_dd0;
    do {
      uStack_de2 = SUB82(psVar19,0);
      sStack_d90.s[0] = 0x6a09e667;
      sStack_d90.s[1] = 0xbb67ae85;
      sStack_d90.s[2] = 0x3c6ef372;
      sStack_d90.s[3] = 0xa54ff53a;
      sStack_d90.s[4] = 0x510e527f;
      sStack_d90.s[5] = 0x9b05688c;
      sStack_d90.s[6] = 0x1f83d9ab;
      sStack_d90.s[7] = 0x5be0cd19;
      sStack_d90.bytes = 0;
      pcStack_df8 = (code *)0x14ebf0;
      secp256k1_sha256_write(psVar24,(uchar *)&uStack_de6,6);
      pcStack_df8 = (code *)0x14ebfb;
      secp256k1_sha256_finalize(psVar24,out32);
      pcStack_df8 = (code *)0x14ec08;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_dd0 + 0x20),out32,(int *)0x0);
      pcStack_df8 = (code *)0x14ec1b;
      test_ecmult_accumulate(&sStack_d20,(secp256k1_scalar *)(auStack_dd0 + 0x20),scratch);
      psVar19 = (secp256k1_gej *)((long)(psVar19->x).n + 1);
    } while (psVar21 != psVar19);
  }
  hash = &sStack_d20;
  psVar11 = (secp256k1_ge *)auStack_dd0;
  pcStack_df8 = (code *)0x14ec35;
  secp256k1_sha256_finalize(hash,(uchar *)psVar11);
  lVar7 = 0;
  while (auStack_dd0[lVar7] == *(char *)(lStack_dd8 + lVar7)) {
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x20) {
      pcStack_df8 = (code *)0x14ec5d;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return extraout_EAX_02;
    }
  }
  pcStack_df8 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_e00 = psVar21;
  auStack_1aa8 = (undefined1  [8])0x41;
  psStack_1ac0 = (secp256k1_scalar *)0x14ecad;
  psStack_e20 = scratch;
  psStack_e18 = psVar24;
  puStack_e10 = auStack_dd0 + 0x20;
  psStack_e08 = psVar19;
  pcStack_df8 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_18c0,&secp256k1_ge_const_g);
  psStack_1ac0 = (secp256k1_scalar *)0x14ecba;
  secp256k1_gej_set_infinity(&sStack_1958);
  psStack_1ac0 = (secp256k1_scalar *)0x14ecd1;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1828 + 1,(secp256k1_scalar *)psVar11);
  psVar17 = (secp256k1_strauss_point_state *)(asStack_1578[5].y.n + 3);
  psStack_1ac0 = (secp256k1_scalar *)0x14ed23;
  sStack_19f0.x.n[0] = (uint64_t)asStack_16f8;
  sStack_19f0.x.n[1] = (uint64_t)asStack_1578;
  sStack_19f0.x.n[2] = (uint64_t)psVar17;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_19f0,&sStack_1828,1,&sStack_18c0,
             (secp256k1_scalar *)psVar11,&secp256k1_scalar_zero);
  psStack_1ac0 = (secp256k1_scalar *)0x14ed53;
  auStack_1aa0._0_8_ = asStack_16f8;
  auStack_1aa0._8_8_ = asStack_1578;
  auStack_1aa0._16_8_ = psVar17;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1aa0,&sStack_19f0,1,&sStack_1958,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar11);
  error_callback = (secp256k1_callback *)0xd0;
  psVar21 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_ge *)0x0;
  psStack_1ac0 = (secp256k1_scalar *)0x14ed84;
  psVar10 = (secp256k1_scalar *)psVar11;
  b = scratch_00;
  iVar4 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar21,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1578[5].y.n + 3),(secp256k1_scalar *)psVar11,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar4 == 0) {
    psStack_1ac0 = (secp256k1_scalar *)0x14eee9;
    test_ecmult_accumulate_cold_8();
LAB_0014eee9:
    psStack_1ac0 = (secp256k1_scalar *)0x14eeee;
    test_ecmult_accumulate_cold_7();
LAB_0014eeee:
    psStack_1ac0 = (secp256k1_scalar *)0x14eef3;
    test_ecmult_accumulate_cold_6();
LAB_0014eef3:
    psStack_1ac0 = (secp256k1_scalar *)0x14eef8;
    test_ecmult_accumulate_cold_5();
LAB_0014eef8:
    psStack_1ac0 = (secp256k1_scalar *)0x14eefd;
    test_ecmult_accumulate_cold_4();
LAB_0014eefd:
    psStack_1ac0 = (secp256k1_scalar *)0x14ef02;
    test_ecmult_accumulate_cold_3();
LAB_0014ef02:
    psStack_1ac0 = (secp256k1_scalar *)0x14ef07;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar10 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1ac0 = (secp256k1_scalar *)0x14edbf;
    b = scratch_00;
    psVar21 = (secp256k1_gej *)error_callback;
    cbdata = psVar11;
    iVar4 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1578,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar11,1);
    if (iVar4 == 0) goto LAB_0014eee9;
    psStack_1ac0 = (secp256k1_scalar *)0x14edde;
    secp256k1_ecmult_const(asStack_16f8,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar11);
    psVar11 = (secp256k1_ge *)auStack_1aa0;
    psStack_1ac0 = (secp256k1_scalar *)0x14edf3;
    secp256k1_ge_set_gej_var(psVar11,&sStack_1828 + 1);
    psVar21 = &sStack_1828;
    psStack_1ac0 = (secp256k1_scalar *)0x14ee03;
    b = psVar11;
    iVar4 = secp256k1_gej_eq_ge_var(psVar21,psVar11);
    if (iVar4 == 0) goto LAB_0014eeee;
    psVar21 = &sStack_19f0;
    b = (secp256k1_ge *)auStack_1aa0;
    psStack_1ac0 = (secp256k1_scalar *)0x14ee1d;
    iVar4 = secp256k1_gej_eq_ge_var(psVar21,b);
    if (iVar4 == 0) goto LAB_0014eef3;
    psVar21 = (secp256k1_gej *)(asStack_1578[5].y.n + 3);
    b = (secp256k1_ge *)auStack_1aa0;
    psStack_1ac0 = (secp256k1_scalar *)0x14ee37;
    iVar4 = secp256k1_gej_eq_ge_var(psVar21,b);
    if (iVar4 == 0) goto LAB_0014eef8;
    psVar21 = asStack_1578;
    b = (secp256k1_ge *)auStack_1aa0;
    psStack_1ac0 = (secp256k1_scalar *)0x14ee51;
    iVar4 = secp256k1_gej_eq_ge_var(psVar21,b);
    if (iVar4 == 0) goto LAB_0014eefd;
    psVar21 = asStack_16f8;
    b = (secp256k1_ge *)auStack_1aa0;
    psStack_1ac0 = (secp256k1_scalar *)0x14ee6b;
    iVar4 = secp256k1_gej_eq_ge_var(psVar21,b);
    if (iVar4 == 0) goto LAB_0014ef02;
    psStack_1ac0 = (secp256k1_scalar *)0x14ee80;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1aa0);
    if (auStack_1aa0._96_4_ != 0) {
      auStack_1aa0[0x68] = 0;
      sVar12 = 1;
LAB_0014eec8:
      psStack_1ac0 = (secp256k1_scalar *)0x14eed2;
      secp256k1_sha256_write(hash,auStack_1aa0 + 0x68,sVar12);
      return extraout_EAX_03;
    }
    psVar21 = (secp256k1_gej *)auStack_1aa0;
    b = (secp256k1_ge *)(auStack_1aa0 + 0x68);
    psVar11 = (secp256k1_ge *)auStack_1aa8;
    psVar10 = (secp256k1_scalar *)0x0;
    psStack_1ac0 = (secp256k1_scalar *)0x14eeb5;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar21,(uchar *)b,(size_t *)psVar11,0);
    if (auStack_1aa8 == (undefined1  [8])0x41) {
      sVar12 = 0x41;
      goto LAB_0014eec8;
    }
  }
  psStack_1ac0 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_1ac0 = &secp256k1_scalar_zero;
  psStack_1ae8 = asStack_16f8;
  psStack_1ae0 = error_callback;
  psStack_1ad0 = psVar11;
  psStack_1ac8 = psVar17;
  secp256k1_gej_set_infinity(r);
  if ((secp256k1_ge *)psVar10 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_23d8.aux = asStack_1fb0;
      sStack_23d8.pre_a = asStack_1e30;
      sStack_23d8.ps = &sStack_23c0;
      secp256k1_ecmult_strauss_wnaf(&sStack_23d8,r,1,r,&secp256k1_scalar_zero,psVar10);
    }
    else {
      if ((b == (secp256k1_ge *)0x0) ||
         (sVar12 = secp256k1_pippenger_max_points
                             ((secp256k1_callback *)psVar21,(secp256k1_scratch *)b), sVar12 == 0)) {
LAB_0014f136:
        iVar4 = secp256k1_ecmult_multi_simple_var(r,psVar10,cb,cbdata,(size_t)hash);
        return iVar4;
      }
      uVar23 = 5000000;
      if (sVar12 < 5000000) {
        uVar23 = sVar12;
      }
      puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_23e0 = (ulong)puVar1 / uVar23 + 1;
      uVar23 = (ulong)puVar1 / uStack_23e0;
      if (uVar23 < 0x57) {
        lVar7 = 0;
        do {
          if (*(char *)((long)(b->x).n + lVar7) != "scratch"[lVar7]) {
            (*(code *)(psVar21->x).n[0])("invalid scratch space",(psVar21->x).n[1]);
            goto LAB_0014f136;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        uVar13 = (b->x).n[3] - (b->x).n[2];
        uVar23 = 0;
        if (0x4a < uVar13) {
          uVar23 = uVar13 - 0x4b;
        }
        if (uVar23 < 0x988) goto LAB_0014f136;
        uVar23 = uVar23 / 0x988;
        if (4999999 < uVar23) {
          uVar23 = 5000000;
        }
        uStack_23e0 = (ulong)puVar1 / uVar23 + 1;
        uVar23 = (ulong)puVar1 / uStack_23e0;
        pcVar8 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar8 = secp256k1_ecmult_pippenger_batch;
      }
      psVar24 = (secp256k1_sha256 *)(uVar23 + 1);
      lVar7 = 0;
      uVar23 = 0;
      do {
        psVar18 = psVar24;
        if (hash < psVar24) {
          psVar18 = hash;
        }
        psVar11 = (secp256k1_ge *)0x0;
        if (uVar23 == 0) {
          psVar11 = (secp256k1_ge *)psVar10;
        }
        iVar4 = (*pcVar8)(psVar21,b,&sStack_23c0,psVar11,cb,cbdata,psVar18,lVar7);
        if (iVar4 == 0) {
          return 0;
        }
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_23c0,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar18);
        uVar23 = uVar23 + 1;
        lVar7 = (long)psVar24->s + lVar7;
      } while (uStack_23e0 != uVar23);
    }
  }
  return 1;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}